

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

void Zyx_TestExact(char *pFileName)

{
  word *pwVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  int nVars_00;
  int iVar5;
  int iVar6;
  FILE *__stream;
  Vec_Wrd_t *vTruths;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  int nNodes;
  int nLutSize;
  int nVars;
  word pSpec [4];
  char Line [1000];
  int local_44c;
  int local_448;
  int local_444;
  int local_440;
  int local_43c;
  word local_438 [4];
  char local_418 [1000];
  
  local_444 = -1;
  local_448 = -1;
  local_44c = -1;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
    return;
  }
  iVar5 = Zyx_TestGetTruthTablePars(pFileName,local_438,&local_444,&local_448,&local_44c);
  nVars_00 = local_444;
  iVar4 = local_44c;
  if (iVar5 == 0) {
    return;
  }
  if (local_444 < 9) {
    local_43c = local_448;
    if (local_448 < 7) {
      if (local_44c < 0x11) {
        vTruths = Zyx_TestCreateTruthTables(local_444,local_44c);
        pcVar8 = fgets(local_418,1000,__stream);
        if (pcVar8 != (char *)0x0) {
          local_440 = nVars_00 + -6;
          uVar3 = 1 << ((byte)local_440 & 0x1f);
          if (nVars_00 < 7) {
            uVar3 = 1;
          }
          if (nVars_00 < 7) {
            local_440 = 0;
          }
          iVar5 = nVars_00;
          do {
            iVar6 = Zyx_TestReadNode(local_418,vTruths,nVars_00,local_43c,iVar5);
            if (iVar6 == 0) {
              if (iVar5 != iVar4 + nVars_00) {
                puts("The number of nodes in the structure is not correct.");
                break;
              }
              bVar2 = (byte)local_440 & 0x1f;
              uVar9 = iVar5 + -1 << bVar2;
              if ((iVar5 + -1 << bVar2 < 0) || (vTruths->nSize <= (int)uVar9)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                              ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
              }
              iVar5 = nVars_00 + -1;
              if (0 < (int)uVar3) {
                pwVar1 = vTruths->pArray;
                uVar7 = 0;
                do {
                  if ((pwVar1 + uVar9)[uVar7] != local_438[uVar7]) {
                    printf("Structure %3d : Verification FAILED.\n");
                    printf("Implementation: ");
                    Dau_DsdPrintFromTruth(pwVar1 + uVar9,nVars_00);
                    printf("Specification:  ");
                    Dau_DsdPrintFromTruth(local_438,nVars_00);
                    goto LAB_0057c404;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar3 != uVar7);
              }
              printf("Structure %3d : Verification successful.\n");
            }
LAB_0057c404:
            iVar5 = iVar5 + 1;
            pcVar8 = fgets(local_418,1000,__stream);
          } while (pcVar8 != (char *)0x0);
        }
        if (vTruths->pArray != (word *)0x0) {
          free(vTruths->pArray);
          vTruths->pArray = (word *)0x0;
        }
        if (vTruths != (Vec_Wrd_t *)0x0) {
          free(vTruths);
        }
        fclose(__stream);
        return;
      }
      pcVar8 = "This tester does not support structures with more than 16 inputs.";
    }
    else {
      pcVar8 = "This tester does not support nodes with more than 6 inputs.";
    }
  }
  else {
    pcVar8 = "This tester does not support functions with more than 8 inputs.";
  }
  puts(pcVar8);
  return;
}

Assistant:

void Zyx_TestExact( char * pFileName )
{
    int iObj, nStrs = 0, nVars = -1, nLutSize = -1, nNodes = -1;
    word * pImpl, pSpec[4]; Vec_Wrd_t * vInfo; char Line[1000];
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return;
    }
    if ( !Zyx_TestGetTruthTablePars( pFileName, pSpec, &nVars, &nLutSize, &nNodes ) )
        return;
    if ( nVars > 8 )
    {
        printf( "This tester does not support functions with more than 8 inputs.\n" );
        return;
    }
    if ( nLutSize > 6 )
    {
        printf( "This tester does not support nodes with more than 6 inputs.\n" );
        return;
    }
    if ( nNodes > 16 )
    {
        printf( "This tester does not support structures with more than 16 inputs.\n" );
        return;
    }
    vInfo = Zyx_TestCreateTruthTables( nVars, nNodes );
    for ( iObj = nVars; fgets(Line, 1000, pFile) != NULL; iObj++ )
    {
        if ( Zyx_TestReadNode( Line, vInfo, nVars, nLutSize, iObj ) )
            continue;
        if ( iObj != nVars + nNodes )
        {
            printf( "The number of nodes in the structure is not correct.\n" );
            break;
        }
        nStrs++;
        pImpl = Zyx_TestTruth( vInfo, iObj-1, Abc_TtWordNum(nVars) );
        if ( Abc_TtEqual( pImpl, pSpec, Abc_TtWordNum(nVars) ) )
            printf( "Structure %3d : Verification successful.\n", nStrs );
        else
        {
            printf( "Structure %3d : Verification FAILED.\n", nStrs );
            printf( "Implementation: " ); Dau_DsdPrintFromTruth( pImpl, nVars );
            printf( "Specification:  " ); Dau_DsdPrintFromTruth( pSpec, nVars );
        }
        iObj = nVars - 1;
    }
    Vec_WrdFree( vInfo );
    fclose( pFile );
}